

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<FileHeader>::copyAppend
          (QGenericArrayOps<FileHeader> *this,FileHeader *b,FileHeader *e)

{
  FileHeader *pFVar1;
  Data *pDVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  FileHeader *pFVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  long lVar37;
  
  if ((b != e) && (b < e)) {
    pFVar1 = (this->super_QArrayDataPointer<FileHeader>).ptr;
    lVar37 = (this->super_QArrayDataPointer<FileHeader>).size;
    do {
      uVar21 = (b->h).signature[0];
      uVar22 = (b->h).signature[1];
      uVar23 = (b->h).signature[2];
      uVar24 = (b->h).signature[3];
      uVar25 = (b->h).version_made[0];
      uVar26 = (b->h).version_made[1];
      uVar27 = (b->h).version_needed[0];
      uVar28 = (b->h).version_needed[1];
      uVar29 = (b->h).general_purpose_bits[0];
      uVar30 = (b->h).general_purpose_bits[1];
      uVar31 = (b->h).compression_method[0];
      uVar32 = (b->h).compression_method[1];
      uVar33 = (b->h).last_mod_file[0];
      uVar34 = (b->h).last_mod_file[1];
      uVar35 = (b->h).last_mod_file[2];
      uVar36 = (b->h).last_mod_file[3];
      uVar13 = (b->h).crc_32[0];
      uVar14 = (b->h).crc_32[1];
      uVar15 = (b->h).crc_32[2];
      uVar16 = (b->h).crc_32[3];
      uVar17 = (b->h).compressed_size[0];
      uVar18 = (b->h).compressed_size[1];
      uVar19 = (b->h).compressed_size[2];
      uVar20 = (b->h).compressed_size[3];
      uVar3 = *(undefined8 *)(b->h).uncompressed_size;
      uVar6 = (b->h).extra_field_length[1];
      uVar7 = (b->h).file_comment_length[0];
      uVar8 = (b->h).file_comment_length[1];
      uVar9 = (b->h).disk_start[0];
      uVar10 = (b->h).disk_start[1];
      uVar11 = (b->h).internal_file_attributes[0];
      uVar12 = (b->h).internal_file_attributes[1];
      uVar4 = *(undefined8 *)(b->h).external_file_attributes;
      pFVar5 = pFVar1 + lVar37;
      (pFVar5->h).extra_field_length[0] = (b->h).extra_field_length[0];
      (pFVar5->h).extra_field_length[1] = uVar6;
      (pFVar5->h).file_comment_length[0] = uVar7;
      (pFVar5->h).file_comment_length[1] = uVar8;
      (pFVar5->h).disk_start[0] = uVar9;
      (pFVar5->h).disk_start[1] = uVar10;
      (pFVar5->h).internal_file_attributes[0] = uVar11;
      (pFVar5->h).internal_file_attributes[1] = uVar12;
      *(undefined8 *)((pFVar5->h).extra_field_length + 8) = uVar4;
      pFVar5 = pFVar1 + lVar37;
      (pFVar5->h).crc_32[0] = uVar13;
      (pFVar5->h).crc_32[1] = uVar14;
      (pFVar5->h).crc_32[2] = uVar15;
      (pFVar5->h).crc_32[3] = uVar16;
      (pFVar5->h).compressed_size[0] = uVar17;
      (pFVar5->h).compressed_size[1] = uVar18;
      (pFVar5->h).compressed_size[2] = uVar19;
      (pFVar5->h).compressed_size[3] = uVar20;
      *(undefined8 *)((pFVar5->h).crc_32 + 8) = uVar3;
      pFVar5 = pFVar1 + lVar37;
      (pFVar5->h).signature[0] = uVar21;
      (pFVar5->h).signature[1] = uVar22;
      (pFVar5->h).signature[2] = uVar23;
      (pFVar5->h).signature[3] = uVar24;
      (pFVar5->h).version_made[0] = uVar25;
      (pFVar5->h).version_made[1] = uVar26;
      (pFVar5->h).version_needed[0] = uVar27;
      (pFVar5->h).version_needed[1] = uVar28;
      (pFVar5->h).general_purpose_bits[0] = uVar29;
      (pFVar5->h).general_purpose_bits[1] = uVar30;
      (pFVar5->h).compression_method[0] = uVar31;
      (pFVar5->h).compression_method[1] = uVar32;
      (pFVar5->h).last_mod_file[0] = uVar33;
      (pFVar5->h).last_mod_file[1] = uVar34;
      (pFVar5->h).last_mod_file[2] = uVar35;
      (pFVar5->h).last_mod_file[3] = uVar36;
      pDVar2 = (b->file_name).d.d;
      pFVar1[lVar37].file_name.d.d = pDVar2;
      pFVar1[lVar37].file_name.d.ptr = (b->file_name).d.ptr;
      pFVar1[lVar37].file_name.d.size = (b->file_name).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->extra_field).d.d;
      pFVar1[lVar37].extra_field.d.d = pDVar2;
      pFVar1[lVar37].extra_field.d.ptr = (b->extra_field).d.ptr;
      pFVar1[lVar37].extra_field.d.size = (b->extra_field).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->file_comment).d.d;
      pFVar1[lVar37].file_comment.d.d = pDVar2;
      pFVar1[lVar37].file_comment.d.ptr = (b->file_comment).d.ptr;
      pFVar1[lVar37].file_comment.d.size = (b->file_comment).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar37 = (this->super_QArrayDataPointer<FileHeader>).size + 1;
      (this->super_QArrayDataPointer<FileHeader>).size = lVar37;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }